

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetRemoveOneFanout(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if (-1 < iObj) {
    iVar7 = -1;
    lVar8 = 0;
    while (iObj < (p->pNtk->vRefs).nSize) {
      if ((p->pNtk->vRefs).pArray[(uint)iObj] <= lVar8) {
        return iVar7;
      }
      iVar1 = (p->vFanouts).nSize;
      if (iVar1 <= iObj) break;
      piVar4 = (p->vFanouts).pArray;
      lVar6 = (long)piVar4[(uint)iObj];
      if ((lVar6 < 0) || (iVar1 <= piVar4[(uint)iObj])) {
LAB_0036449f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar1 = piVar4[lVar6 + lVar8 * 2 + 1];
      if (((long)iVar1 < 0) || ((p->vFanins).nSize <= iVar1)) goto LAB_0036449f;
      piVar3 = (p->vFanins).pArray;
      if (piVar3 == (int *)0x0) {
        return iVar7;
      }
      iVar2 = iVar7;
      if (piVar4[lVar6 + lVar8 * 2] != 0) {
        piVar3 = piVar3 + iVar1;
        if (*piVar3 == 0) {
          __assert_fail("pLink[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1bf,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
        }
        piVar4 = Wln_RetHeadToTail(p,piVar3);
        if ((*piVar4 < -1) || (uVar5 = *piVar4 + 1, (p->vEdgeLinks).nSize <= (int)uVar5)) break;
        iVar2 = (p->vEdgeLinks).pArray[uVar5];
        *piVar4 = 0;
        if (((long)iVar2 < 0) || ((p->pNtk->vTypes).nSize <= iVar2)) break;
        if ((p->pNtk->vTypes).pArray[iVar2] != 0x59) {
          __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1c3,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
        }
        if (iVar7 != -1) {
          iVar2 = iVar7;
        }
      }
      iVar7 = iVar2;
      lVar8 = lVar8 + 1;
      if (iObj < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_RetRemoveOneFanout( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    //int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanout( p, iObj, iFanin, pLink, k )
    {
        assert( pLink[0] );
        pLink = Wln_RetHeadToTail( p, pLink );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pLink[0] = 0;
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}